

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::FtraceDescriptor::FtraceDescriptor
          (FtraceDescriptor *this,FtraceDescriptor *param_1)

{
  FtraceDescriptor *param_1_local;
  FtraceDescriptor *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FtraceDescriptor_009c0c78;
  std::
  vector<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ::vector(&this->atrace_categories_,&param_1->atrace_categories_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

FtraceDescriptor::FtraceDescriptor(FtraceDescriptor&&) noexcept = default;